

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O1

optional<unsigned_long_long> __thiscall QMetaEnum::keysToValue64(QMetaEnum *this,char *keys)

{
  uint uVar1;
  uint uVar2;
  QMetaObject *pQVar3;
  uint *puVar4;
  uint *puVar5;
  QMetaTypeInterface *pQVar6;
  uint *puVar7;
  long lVar8;
  QByteArrayView view;
  QByteArrayView scope;
  char *__n;
  undefined1 *__s1;
  bool bVar9;
  int iVar10;
  size_t __n_00;
  void *pvVar11;
  R_conflict6 *pRVar12;
  undefined7 extraout_var;
  undefined4 extraout_var_00;
  long lVar13;
  _Storage<unsigned_long_long,_true> __s;
  qsizetype qVar14;
  size_t from;
  undefined1 *puVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  undefined1 *puVar20;
  _Storage<unsigned_long_long,_true> _Var21;
  _Storage<unsigned_long_long,_true> unaff_R15;
  char *b;
  long in_FS_OFFSET;
  QByteArrayView QVar22;
  optional<unsigned_long_long> oVar23;
  R_conflict6 parsed;
  QVarLengthArray<QByteArrayView,_10LL> list;
  storage_type *in_stack_fffffffffffffe98;
  QByteArrayView local_128;
  _Storage<QByteArrayView,_true> local_118;
  undefined4 uStack_108;
  undefined4 uStack_104;
  char *pcStack_100;
  undefined1 *local_f8;
  QVLABase<QByteArrayView> local_f0;
  undefined1 local_d8 [160];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = this->mobj;
  if (keys == (char *)0x0 || pQVar3 == (QMetaObject *)0x0) {
    uVar17 = 0;
    goto LAB_002876ff;
  }
  puVar4 = (this->data).d;
  uVar19 = puVar4[2];
  iVar18 = 0x40;
  if (((uVar19 & 0x40) == 0) && (iVar18 = 0, (uVar19 & 1) == 0)) {
    puVar5 = (pQVar3->d).data;
    pQVar6 = (pQVar3->d).metaTypes
             [(long)(int)puVar5[6] +
              (ulong)((int)((ulong)((long)puVar4 - (long)puVar5) >> 2) - puVar5[9]) / 5];
    if (pQVar6 == (QMetaTypeInterface *)0x0) {
      iVar18 = -1;
    }
    else {
      iVar18 = ((pQVar6->flags >> 8 & 1) != 0) - 1;
    }
  }
  memset(&local_f0,0xaa,0xb8);
  local_f0.super_QVLABaseBase.a = 10;
  local_f0.super_QVLABaseBase.s = 0;
  local_f0.super_QVLABaseBase.ptr = local_d8;
  local_128.m_size = -1;
  do {
    lVar13 = local_128.m_size + 1;
    local_128.m_size = local_128.m_size + 1;
  } while (keys[lVar13] != '\0');
  local_128.m_data = keys;
  QVar22.m_data = in_stack_fffffffffffffe98;
  QVar22.m_size = 0x287347;
  local_128 = QtPrivate::trimmed(QVar22);
  __s._M_value = (unsigned_long_long)local_128.m_data;
  __n_00 = local_128.m_size;
  if (__n_00 == 0) {
    local_118._M_value.m_size._0_4_ = 2;
    local_118._M_value.m_size._4_4_ = 0;
    local_118._8_4_ = 0;
    local_118._12_4_ = 0;
    uStack_108 = 0;
    uStack_104 = 0;
    pcStack_100 = "default";
    QMessageLogger::warning
              ((QMessageLogger *)&local_118._M_value,"QMetaEnum::keysToValue: empty keys string.");
LAB_002876da:
    uVar17 = 0;
    unaff_R15 = (_Storage<unsigned_long_long,_true>)keys;
  }
  else {
    if (((long)__n_00 < 1) || (pvVar11 = memchr((void *)__s,0x7c,__n_00), pvVar11 == (void *)0x0)) {
      qVar14 = -1;
    }
    else {
      qVar14 = (long)pvVar11 - (long)__s;
    }
    if (qVar14 != -1) {
      keys = (char *)__s._M_value;
      if (qVar14 == 0) {
        local_118._M_value.m_size._0_4_ = 2;
        local_118._M_value.m_size._4_4_ = 0;
        local_118._8_4_ = 0;
        local_118._12_4_ = 0;
        uStack_108 = 0;
        uStack_104 = 0;
        pcStack_100 = "default";
        QMessageLogger::warning
                  ((QMessageLogger *)&local_118._M_value,
                   "QMetaEnum::keysToValue: malformed keys string, starts with \'|\', \"%s\"",
                   __s._M_value);
      }
      else {
        if (((char *)(__s._M_value - 1))[__n_00] != '|') {
          _Var21._M_value = __s._M_value;
          if (qVar14 != -1) {
            do {
              local_118._M_value.m_size = (long)(__s._M_value + qVar14) - (long)_Var21;
              local_118._8_4_ = (undefined4)_Var21._M_value;
              local_118._12_4_ = (undefined4)((ulong)_Var21 >> 0x20);
              QVLABase<QByteArrayView>::emplace_back_impl<QByteArrayView>
                        (&local_f0,10,local_d8,&local_118._M_value);
              if (((char *)(__s._M_value + 1))[qVar14] == '|') {
                local_118._M_value.m_size._0_4_ = 2;
                local_118._M_value.m_size._4_4_ = 0;
                local_118._8_4_ = 0;
                local_118._12_4_ = 0;
                uStack_108 = 0;
                uStack_104 = 0;
                pcStack_100 = "default";
                QMessageLogger::warning
                          ((QMessageLogger *)&local_118._M_value,
                           "QMetaEnum::keysToValue: malformed keys string, has two consecutive \'|\': \"%s\""
                           ,local_128.m_data);
                goto LAB_002876da;
              }
              _Var21._M_value = (long)(__s._M_value + qVar14) + 1;
              from = qVar14 + 1;
              qVar14 = QByteArrayView::indexOf(&local_128,'|',from);
            } while ((from != __n_00) && (qVar14 != -1));
          }
          local_118._M_value.m_size = (long)(__s._M_value + __n_00) - (long)_Var21;
          local_118._8_4_ = (undefined4)_Var21._M_value;
          local_118._12_4_ = (undefined4)((ulong)_Var21 >> 0x20);
          QVLABase<QByteArrayView>::emplace_back_impl<QByteArrayView>
                    (&local_f0,10,local_d8,&local_118._M_value);
          goto LAB_0028750f;
        }
        local_118._M_value.m_size._0_4_ = 2;
        local_118._M_value.m_size._4_4_ = 0;
        local_118._8_4_ = 0;
        local_118._12_4_ = 0;
        uStack_108 = 0;
        uStack_104 = 0;
        pcStack_100 = "default";
        QMessageLogger::warning
                  ((QMessageLogger *)&local_118._M_value,
                   "QMetaEnum::keysToValue: malformed keys string, ends with \'|\', \"%s\"",
                   __s._M_value);
      }
      goto LAB_002876da;
    }
    QVLABase<QByteArrayView>::emplace_back_impl<QByteArrayView_const&>
              (&local_f0,10,local_d8,&local_128);
LAB_0028750f:
    if (local_f0.super_QVLABaseBase.s == 0) {
      unaff_R15._M_value = 0;
      puVar15 = (undefined1 *)0x0;
    }
    else {
      puVar15 = (undefined1 *)
                ((long)local_f0.super_QVLABaseBase.ptr + local_f0.super_QVLABaseBase.s * 0x10);
      unaff_R15._M_value = 0;
      puVar20 = (undefined1 *)local_f0.super_QVLABaseBase.ptr;
      do {
        local_f8 = &DAT_aaaaaaaaaaaaaaaa;
        uStack_108 = 0xaaaaaaaa;
        uStack_104 = 0xaaaaaaaa;
        pcStack_100 = &DAT_aaaaaaaaaaaaaaaa;
        local_118._M_value.m_size._0_4_ = 0xaaaaaaaa;
        local_118._M_value.m_size._4_4_ = 0xaaaaaaaa;
        local_118._8_4_ = 0xaaaaaaaa;
        local_118._12_4_ = 0xaaaaaaaa;
        view.m_data = in_stack_fffffffffffffe98;
        view.m_size = 0x28756a;
        QVar22 = QtPrivate::trimmed(view);
        pRVar12 = parse_scope((R_conflict6 *)&local_118._M_value,QVar22);
        keys = (char *)unaff_R15;
        if ((char)uStack_108 == '\x01') {
          scope.m_size._4_4_ = local_118._M_value.m_size._4_4_;
          scope.m_size._0_4_ = local_118._M_value.m_size._0_4_;
          scope.m_data._0_4_ = local_118._8_4_;
          scope.m_data._4_4_ = local_118._12_4_;
          bVar9 = isScopeMatch(scope,this);
          pRVar12 = (R_conflict6 *)CONCAT71(extraout_var,bVar9);
          if (!bVar9) goto LAB_002876da;
        }
        __s1 = local_f8;
        __n = pcStack_100;
        puVar4 = (this->data).d;
        uVar1 = puVar4[3];
        lVar13 = (long)(int)uVar1;
        bVar9 = 0 < lVar13;
        if (0 < lVar13) {
          puVar5 = (this->mobj->d).stringdata;
          puVar7 = (this->mobj->d).data;
          uVar2 = puVar4[4];
          keys._0_4_ = (uVar2 + uVar1 * 3) - 1;
          keys._4_4_ = 0;
          uVar19 = (uVar2 + uVar1 * 2) - 1;
          bVar9 = true;
          lVar13 = lVar13 + 1;
          do {
            pRVar12 = (R_conflict6 *)(long)(int)puVar7[uVar19 - 1];
            if (__n == (char *)(ulong)puVar5[(int)(puVar7[uVar19 - 1] * 2 + 1)]) {
              if (__n != (char *)0x0) {
                iVar10 = bcmp(__s1,(void *)((ulong)puVar5[(long)pRVar12 * 2] + (long)puVar5),
                              (size_t)__n);
                pRVar12 = (R_conflict6 *)CONCAT44(extraout_var_00,iVar10);
                if (iVar10 != 0) goto LAB_00287637;
              }
              uVar19 = puVar7[uVar19];
              if (iVar18 < 1) {
                pRVar12 = (R_conflict6 *)(long)(int)uVar19;
                if (iVar18 == 0) {
                  pRVar12 = (R_conflict6 *)(ulong)uVar19;
                }
              }
              else {
                pRVar12 = (R_conflict6 *)CONCAT44(puVar7[(long)keys],uVar19);
              }
              break;
            }
LAB_00287637:
            lVar16 = lVar13 + -1;
            keys._0_4_ = (int)keys - 1;
            keys._4_4_ = 0;
            uVar19 = uVar19 - 2;
            lVar8 = lVar13 + -3;
            bVar9 = 1 < lVar16;
            lVar13 = lVar16;
          } while (SBORROW8(lVar16,2) == lVar8 < 0);
        }
        if (!bVar9) goto LAB_002876da;
        unaff_R15._M_value = unaff_R15._M_value | (ulong)pRVar12;
        puVar20 = puVar20 + 0x10;
      } while (puVar20 != puVar15);
    }
    uVar17 = CONCAT71((int7)((ulong)puVar15 >> 8),1);
  }
  if ((undefined1 *)local_f0.super_QVLABaseBase.ptr != local_d8) {
    QtPrivate::sizedFree(local_f0.super_QVLABaseBase.ptr,local_f0.super_QVLABaseBase.a << 4);
  }
LAB_002876ff:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  oVar23.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long_long>._8_8_ = uVar17 & 0xffffffff;
  oVar23.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long_long>._M_payload._M_value = unaff_R15._M_value;
  return (optional<unsigned_long_long>)
         oVar23.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long_long>;
}

Assistant:

std::optional<quint64> QMetaEnum::keysToValue64(const char *keys) const
{
    if (!mobj || !keys)
        return std::nullopt;

    EnumExtendMode mode = enumExtendMode(*this);
    auto lookup = [&] (QByteArrayView key) -> std::optional<quint64> {
        for (int i = data.keyCount() - 1; i >= 0; --i) {
            if (key == stringDataView(mobj, mobj->d.data[data.data() + 2*i]))
                return value_helper(i, mode);
        }
        return std::nullopt;
    };

    quint64 value = 0;
    QVarLengthArray<QByteArrayView, 10> list;
    const bool r = parseEnumFlags(QByteArrayView{keys}, list);
    if (!r)
        return std::nullopt;
    for (const auto &untrimmed : list) {
        const auto parsed = parse_scope(untrimmed.trimmed());
        if (parsed.scope && !isScopeMatch(*parsed.scope, this))
            return std::nullopt; // wrong type name in qualified name
        if (auto thisValue = lookup(parsed.key))
            value |= *thisValue;
        else
            return std::nullopt; // no such enumerator
    }
    return value;
}